

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O1

SegmentReader * __thiscall capnp::_::ReaderArena::tryGetSegment(ReaderArena *this,SegmentId id)

{
  MutexGuarded<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>_>_>
  *pMVar1;
  int iVar2;
  SegmentWordCount SVar3;
  undefined4 extraout_var;
  SegmentReader *params;
  word *extraout_RDX;
  SegmentReader *this_00;
  bool bVar4;
  ArrayPtr<const_capnp::word> segment;
  Locked<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>_>_>
  lock;
  Own<capnp::_::SegmentReader,_std::nullptr_t> local_58;
  Mutex *local_48;
  Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>_> *local_40;
  Table<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader,decltype(nullptr)>>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader,decltype(nullptr)>>::Callbacks>>
  local_38;
  undefined7 uStack_37;
  
  if (id.value == 0) {
    params = &this->segment0;
    if ((this->segment0).ptr.size_ == 0) {
      params = (SegmentReader *)0x0;
    }
  }
  else {
    pMVar1 = &this->moreSegments;
    local_38 = (Table<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader,decltype(nullptr)>>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader,decltype(nullptr)>>::Callbacks>>
                )0x0;
    kj::_::Mutex::lock(&pMVar1->mutex);
    local_40 = &(this->moreSegments).value;
    bVar4 = (this->moreSegments).value.ptr.isSet;
    params = (SegmentReader *)&(this->moreSegments).value.ptr.field_1;
    if (bVar4 == false) {
      params = (SegmentReader *)0x0;
    }
    local_48 = &pMVar1->mutex;
    if (bVar4 == true) {
      kj::
      Table<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader,decltype(nullptr)>>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader,decltype(nullptr)>>::Callbacks>>
      ::find<0ul,unsigned_int&>(&local_38,(uint *)params);
      bVar4 = CONCAT71(uStack_37,local_38) == 0;
      this_00 = params;
      if (!bVar4) {
        params = *(SegmentReader **)(CONCAT71(uStack_37,local_38) + 0x10);
        this_00 = (SegmentReader *)0x0;
      }
    }
    else {
      bVar4 = true;
      this_00 = (SegmentReader *)0x0;
    }
    if (bVar4) {
      iVar2 = (*this->message->_vptr_MessageReader[2])();
      if (extraout_RDX == (word *)0x0) {
        params = (SegmentReader *)0x0;
      }
      else {
        segment.size_ = (size_t)extraout_RDX;
        segment.ptr = extraout_RDX;
        SVar3 = verifySegment((_ *)CONCAT44(extraout_var,iVar2),segment);
        if ((local_40->ptr).isSet == false) {
          this_00 = (SegmentReader *)&(local_40->ptr).field_1;
          (local_40->ptr).field_1.value.table.rows.builder.endPtr = (Entry *)0x0;
          (local_40->ptr).field_1.value.table.rows.builder.disposer = (ArrayDisposer *)0x0;
          (local_40->ptr).field_1.value.table.indexes.buckets.ptr = (HashBucket *)0x0;
          (local_40->ptr).field_1.value.table.indexes.buckets.size_ = 0;
          *(undefined8 *)&(local_40->ptr).field_1.value.table.indexes = 0;
          (local_40->ptr).field_1.value.table.indexes.erasedCount = 0;
          (local_40->ptr).field_1.value.table.rows.builder.ptr = (Entry *)0x0;
          (local_40->ptr).field_1.value.table.rows.builder.pos =
               (RemoveConst<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry> *)
               0x0;
          (local_40->ptr).field_1.value.table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
          (local_40->ptr).field_1.value.table.rows.builder.disposer =
               (ArrayDisposer *)&kj::NullArrayDisposer::instance;
          (local_40->ptr).field_1.value.table.indexes.erasedCount = 0;
          (local_40->ptr).field_1.value.table.indexes.buckets.ptr = (HashBucket *)0x0;
          (local_40->ptr).field_1.value.table.indexes.buckets.size_ = 0;
          (local_40->ptr).field_1.value.table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
          (local_40->ptr).isSet = true;
        }
        params = (SegmentReader *)operator_new(0x28);
        params->arena = &this->super_Arena;
        (params->id).value = id.value;
        (params->ptr).ptr = (word *)CONCAT44(extraout_var,iVar2);
        (params->ptr).size_ = (ulong)SVar3;
        params->readLimiter = &this->readLimiter;
        local_58.disposer = (Disposer *)&kj::_::HeapDisposer<capnp::_::SegmentReader>::instance;
        local_58.ptr = params;
        kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>::insert
                  ((HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_> *)
                   this_00,id.value,&local_58);
        if (local_58.ptr != (SegmentReader *)0x0) {
          local_58.ptr = (SegmentReader *)0x0;
          (**(local_58.disposer)->_vptr_Disposer)();
        }
      }
    }
    if (local_48 != (Mutex *)0x0) {
      kj::_::Mutex::unlock(local_48,EXCLUSIVE,(Waiter *)0x0);
    }
  }
  return params;
}

Assistant:

SegmentReader* ReaderArena::tryGetSegment(SegmentId id) {
  if (id == SegmentId(0)) {
    if (segment0.getArray() == nullptr) {
      return nullptr;
    } else {
      return &segment0;
    }
  }

  auto lock = moreSegments.lockExclusive();

  SegmentMap* segments = nullptr;
  KJ_IF_SOME(s, *lock) {
    KJ_IF_SOME(segment, s.find(id.value)) {
      return segment;
    }
    segments = &s;
  }

  kj::ArrayPtr<const word> newSegment = message->getSegment(id.value);
  if (newSegment == nullptr) {
    return nullptr;
  }

  SegmentWordCount newSegmentSize = verifySegment(newSegment);

  if (*lock == kj::none) {
    // OK, the segment exists, so allocate the map.
    segments = &lock->emplace();
  }

  auto segment = kj::heap<SegmentReader>(
      this, id, newSegment.begin(), newSegmentSize, &readLimiter);
  SegmentReader* result = segment;
  segments->insert(id.value, kj::mv(segment));
  return result;
}